

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::remove_filename(SmallVectorImpl<char> *path,Style style)

{
  iterator data;
  size_t length;
  StringRef local_30;
  size_t local_20;
  size_t end_pos;
  SmallVectorBase *pSStack_10;
  Style style_local;
  SmallVectorImpl<char> *path_local;
  
  end_pos._4_4_ = style;
  pSStack_10 = (SmallVectorBase *)path;
  data = SmallVectorTemplateCommon<char,_void>::begin((SmallVectorTemplateCommon<char,_void> *)path)
  ;
  length = SmallVectorBase::size(pSStack_10);
  StringRef::StringRef(&local_30,data,length);
  local_20 = anon_unknown.dwarf_3697931::parent_path_end(local_30,end_pos._4_4_);
  if (local_20 != 0xffffffffffffffff) {
    SmallVectorBase::set_size(pSStack_10,local_20);
  }
  return;
}

Assistant:

void remove_filename(SmallVectorImpl<char> &path, Style style) {
  size_t end_pos = parent_path_end(StringRef(path.begin(), path.size()), style);
  if (end_pos != StringRef::npos)
    path.set_size(end_pos);
}